

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

UniValue * __thiscall UniValue::operator[](UniValue *this,string *key)

{
  pointer pUVar1;
  bool bVar2;
  UniValue *pUVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  size_t index;
  size_t local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == VOBJ) {
    local_18 = 0;
    bVar2 = findKey(this,key,&local_18);
    if (!bVar2) goto LAB_001063eb;
    pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3;
    if (uVar4 < local_18 || uVar4 - local_18 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      goto LAB_00106426;
    }
    pUVar3 = pUVar1 + local_18;
  }
  else {
LAB_001063eb:
    pUVar3 = &NullUniValue;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pUVar3;
  }
LAB_00106426:
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](const std::string& key) const
{
    if (typ != VOBJ)
        return NullUniValue;

    size_t index = 0;
    if (!findKey(key, index))
        return NullUniValue;

    return values.at(index);
}